

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  long lVar1;
  long lVar2;
  Function *pFVar3;
  FunctionCall *pFVar4;
  long lVar5;
  Module *local_40;
  Module *local_38;
  
  this_00 = this->newModule;
  local_38 = *(Module **)(__fn + 0x20);
  cloneExpressionPtr((ModuleCloner *)&stack0xffffffffffffffc0,
                     (pool_ptr<soul::heart::Expression> *)this);
  pFVar3 = pool_ptr<soul::heart::Function>::operator*
                     ((pool_ptr<soul::heart::Function> *)(__fn + 0x28));
  pFVar3 = getRemappedFunction(this,pFVar3);
  pFVar4 = Module::
           allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
                     (this_00,(CodeLocation *)(__fn + 8),
                      (pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffc0,pFVar3);
  lVar1 = *(long *)(__fn + 0x30);
  lVar2 = *(long *)(__fn + 0x38);
  for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    local_40 = (Module *)cloneExpression(this,*(Expression **)(lVar1 + lVar5));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (&pFVar4->arguments,(pool_ref<soul::heart::Expression> *)&stack0xffffffffffffffc0);
  }
  return (int)pFVar4;
}

Assistant:

heart::FunctionCall& clone (const heart::FunctionCall& old)
    {
        auto& fc = newModule.allocate<heart::FunctionCall> (old.location,
                                                            cloneExpressionPtr (old.target),
                                                            getRemappedFunction (old.getFunction()));

        for (auto& arg : old.arguments)
            fc.arguments.push_back (cloneExpression (arg));

        return fc;
    }